

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

parser_error parse_normal(parser *p)

{
  long lVar1;
  wchar_t tval_00;
  wchar_t sval_00;
  void *pvVar2;
  char *pcVar3;
  object_kind *poVar4;
  void *pvVar5;
  object_kind *kind;
  wchar_t sval;
  wchar_t tval;
  store *s;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  pcVar3 = parser_getsym(p,"tval");
  tval_00 = tval_find_idx(pcVar3);
  pcVar3 = parser_getsym(p,"sval");
  sval_00 = lookup_sval(tval_00,pcVar3);
  poVar4 = lookup_kind(tval_00,sval_00);
  if (poVar4 == (object_kind *)0x0) {
    p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_SVAL;
  }
  else {
    if (*(long *)((long)pvVar2 + 0x68) == 0) {
      *(undefined8 *)((long)pvVar2 + 0x60) = 0x10;
      pvVar5 = mem_zalloc(*(long *)((long)pvVar2 + 0x60) << 3);
      *(void **)((long)pvVar2 + 0x70) = pvVar5;
    }
    else if (*(ulong *)((long)pvVar2 + 0x60) <= *(ulong *)((long)pvVar2 + 0x68)) {
      *(long *)((long)pvVar2 + 0x60) = *(long *)((long)pvVar2 + 0x60) + 8;
      pvVar5 = mem_realloc(*(void **)((long)pvVar2 + 0x70),*(long *)((long)pvVar2 + 0x60) << 3);
      *(void **)((long)pvVar2 + 0x70) = pvVar5;
    }
    lVar1 = *(long *)((long)pvVar2 + 0x68);
    *(long *)((long)pvVar2 + 0x68) = lVar1 + 1;
    *(object_kind **)(*(long *)((long)pvVar2 + 0x70) + lVar1 * 8) = poVar4;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_normal(struct parser *p) {
	struct store *s = parser_priv(p);
	int tval = tval_find_idx(parser_getsym(p, "tval"));
	int sval = lookup_sval(tval, parser_getsym(p, "sval"));

	struct object_kind *kind = lookup_kind(tval, sval);
	if (!kind)
		return PARSE_ERROR_UNRECOGNISED_SVAL;

	/* Expand if necessary */
	if (!s->normal_num) {
		s->normal_size = 16;
		s->normal_table = mem_zalloc(s->normal_size * sizeof *s->normal_table);
	} else if (s->normal_num >= s->normal_size) {
		s->normal_size += 8; 
		s->normal_table = mem_realloc(s->normal_table,
									  s->normal_size * sizeof *s->normal_table);
	}

	s->normal_table[s->normal_num++] = kind;

	return PARSE_ERROR_NONE;
}